

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream.c
# Opt level: O1

UINT8 AudioDrv_WriteData(void *drvStruct,UINT32 dataSize,void *data)

{
  long lVar1;
  UINT8 UVar2;
  undefined8 *puVar3;
  
  UVar2 = (**(code **)(*(long *)((long)drvStruct + 8) + 0x80))
                    (*(undefined8 *)((long)drvStruct + 0x20));
  OSMutex_Lock(*(OS_MUTEX **)((long)drvStruct + 0x40));
  for (puVar3 = *(undefined8 **)((long)drvStruct + 0x38); puVar3 != (undefined8 *)0x0;
      puVar3 = (undefined8 *)puVar3[1]) {
    if ((*(int *)*puVar3 != -1) && (lVar1 = *(long *)((int *)*puVar3 + 2), lVar1 != 0)) {
      (**(code **)(lVar1 + 0x80))(*(undefined8 *)((long)drvStruct + 0x20),dataSize,data);
    }
  }
  OSMutex_Unlock(*(OS_MUTEX **)((long)drvStruct + 0x40));
  return UVar2;
}

Assistant:

UINT8 AudioDrv_WriteData(void* drvStruct, UINT32 dataSize, void* data)
{
	ADRV_INSTANCE* audInst = (ADRV_INSTANCE*)drvStruct;
	AUDIO_DRV* aDrv = audInst->drvStruct;
	ADRV_LIST* fwdList;
	const ADRV_INSTANCE* fwdInst;
	UINT8 retVal;
	
	retVal = aDrv->WriteData(audInst->drvData, dataSize, data);
	
	OSMutex_Lock(audInst->hMutex);
	fwdList = audInst->forwardDrvs;
	while(fwdList != NULL)
	{
		fwdInst = fwdList->drvInst;
		if (fwdInst->ID != ADID_UNUSED && fwdInst->drvStruct != NULL)
			fwdInst->drvStruct->WriteData(audInst->drvData, dataSize, data);
		fwdList = fwdList->next;
	}
	OSMutex_Unlock(audInst->hMutex);
	return retVal;
}